

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O0

void __thiscall
cinject::ComponentBuilderBase<IWalker,IRunner,IJumper,IFlyer,IWaterConsumer,Bird>::
registerType<Bird,cinject::InstanceStorage<Bird,cinject::ConstructorFactory<Bird,void>>,IWalker,IRunner,IJumper,IFlyer,IWaterConsumer,Bird>
          (ComponentBuilderBase<IWalker,IRunner,IJumper,IFlyer,IWaterConsumer,Bird> *this,
          shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>
          *instanceStorage)

{
  shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_> local_48 [2]
  ;
  shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_> local_28;
  shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_> *local_18;
  shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>
  *instanceStorage_local;
  ComponentBuilderBase<IWalker,_IRunner,_IJumper,_IFlyer,_IWaterConsumer,_Bird> *this_local;
  
  local_18 = instanceStorage;
  instanceStorage_local =
       (shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_> *)this
  ;
  std::shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>::
  shared_ptr(&local_28,instanceStorage);
  addRegistration<Bird,cinject::InstanceStorage<Bird,cinject::ConstructorFactory<Bird,void>>,IWalker>
            (this,&local_28);
  std::shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>::
  ~shared_ptr(&local_28);
  std::shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>::
  shared_ptr(local_48,instanceStorage);
  registerType<Bird,cinject::InstanceStorage<Bird,cinject::ConstructorFactory<Bird,void>>,IRunner,IJumper,IFlyer,IWaterConsumer,Bird>
            (this,local_48);
  std::shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>::
  ~shared_ptr(local_48);
  return;
}

Assistant:

void registerType(std::shared_ptr<TInstanceStorage> instanceStorage)
    {
        // register
        addRegistration<TImplementation, TInstanceStorage, TComponent1>(instanceStorage);


        registerType<TImplementation, TInstanceStorage, TComponentOther, TRest...>(instanceStorage);
    }